

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_RecoverDuringMemtableCompaction::_Run(_Test_RecoverDuringMemtableCompaction *this)

{
  bool bVar1;
  allocator local_1049;
  Snapshot local_1048 [4];
  undefined1 local_1028 [40];
  string local_1000 [32];
  Tester local_fe0;
  allocator local_e39;
  Snapshot local_e38 [4];
  undefined1 local_e18 [40];
  string local_df0 [32];
  Tester local_dd0;
  allocator local_c29;
  Snapshot local_c28 [4];
  undefined1 local_c08 [455];
  allocator local_a41;
  Snapshot local_a40 [4];
  undefined1 local_a20 [455];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [32];
  undefined1 local_810 [431];
  allocator local_661;
  string local_660 [39];
  allocator local_639;
  string local_638 [32];
  undefined1 local_618 [431];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [32];
  undefined1 local_420 [431];
  allocator local_271;
  string local_270 [55];
  allocator local_239;
  string local_238 [32];
  undefined1 local_218 [424];
  undefined1 local_70 [8];
  Options options;
  _Test_RecoverDuringMemtableCompaction *this_local;
  
  options.filter_policy = (FilterPolicy *)this;
  do {
    DBTest::CurrentOptions((Options *)local_70,&this->super_DBTest);
    options._8_8_ = (this->super_DBTest).env_;
    options.info_log = (Logger *)0xf4240;
    DBTest::Reopen(&this->super_DBTest,(Options *)local_70);
    test::Tester::Tester
              ((Tester *)(local_218 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"foo",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"v1",&local_271);
    DBTest::Put((DBTest *)local_218,(string *)this,(string *)local_238);
    test::Tester::IsOk((Tester *)(local_218 + 8),(Status *)local_218);
    Status::~Status((Status *)local_218);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    test::Tester::~Tester((Tester *)(local_218 + 8));
    test::Tester::Tester
              ((Tester *)(local_420 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,"big1",&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,10000000,'x',&local_469);
    DBTest::Put((DBTest *)local_420,(string *)this,(string *)local_440);
    test::Tester::IsOk((Tester *)(local_420 + 8),(Status *)local_420);
    Status::~Status((Status *)local_420);
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::__cxx11::string::~string(local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    test::Tester::~Tester((Tester *)(local_420 + 8));
    test::Tester::Tester
              ((Tester *)(local_618 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_638,"big2",&local_639);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_660,1000,'y',&local_661);
    DBTest::Put((DBTest *)local_618,(string *)this,(string *)local_638);
    test::Tester::IsOk((Tester *)(local_618 + 8),(Status *)local_618);
    Status::~Status((Status *)local_618);
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::__cxx11::string::~string(local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    test::Tester::~Tester((Tester *)(local_618 + 8));
    test::Tester::Tester
              ((Tester *)(local_810 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_830,"bar",&local_831);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_858,"v2",&local_859);
    DBTest::Put((DBTest *)local_810,(string *)this,(string *)local_830);
    test::Tester::IsOk((Tester *)(local_810 + 8),(Status *)local_810);
    Status::~Status((Status *)local_810);
    std::__cxx11::string::~string(local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    std::__cxx11::string::~string(local_830);
    std::allocator<char>::~allocator((allocator<char> *)&local_831);
    test::Tester::~Tester((Tester *)(local_810 + 8));
    DBTest::Reopen(&this->super_DBTest,(Options *)local_70);
    test::Tester::Tester
              ((Tester *)(local_a20 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a40,"foo",&local_a41);
    DBTest::Get((DBTest *)local_a20,(string *)this,local_a40);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_a20 + 0x20),(char (*) [3])"v1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a20);
    std::__cxx11::string::~string((string *)local_a20);
    std::__cxx11::string::~string((string *)local_a40);
    std::allocator<char>::~allocator((allocator<char> *)&local_a41);
    test::Tester::~Tester((Tester *)(local_a20 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_c08 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_c28,"bar",&local_c29);
    DBTest::Get((DBTest *)local_c08,(string *)this,local_c28);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_c08 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c08);
    std::__cxx11::string::~string((string *)local_c08);
    std::__cxx11::string::~string((string *)local_c28);
    std::allocator<char>::~allocator((allocator<char> *)&local_c29);
    test::Tester::~Tester((Tester *)(local_c08 + 0x20));
    test::Tester::Tester
              (&local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_df0,10000000,'x',(allocator *)(local_e18 + 0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e38,"big1",&local_e39);
    DBTest::Get((DBTest *)local_e18,(string *)this,local_e38);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              (&local_dd0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18);
    std::__cxx11::string::~string((string *)local_e18);
    std::__cxx11::string::~string((string *)local_e38);
    std::allocator<char>::~allocator((allocator<char> *)&local_e39);
    std::__cxx11::string::~string(local_df0);
    std::allocator<char>::~allocator((allocator<char> *)(local_e18 + 0x27));
    test::Tester::~Tester(&local_dd0);
    test::Tester::Tester
              (&local_fe0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1000,1000,'y',(allocator *)(local_1028 + 0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1048,"big2",&local_1049);
    DBTest::Get((DBTest *)local_1028,(string *)this,local_1048);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
              (&local_fe0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1000,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1028);
    std::__cxx11::string::~string((string *)local_1028);
    std::__cxx11::string::~string((string *)local_1048);
    std::allocator<char>::~allocator((allocator<char> *)&local_1049);
    std::__cxx11::string::~string(local_1000);
    std::allocator<char>::~allocator((allocator<char> *)(local_1028 + 0x27));
    test::Tester::~Tester(&local_fe0);
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, RecoverDuringMemtableCompaction) {
  do {
    Options options = CurrentOptions();
    options.env = env_;
    options.write_buffer_size = 1000000;
    Reopen(&options);

    // Trigger a long memtable compaction and reopen the database during it
    ASSERT_OK(Put("foo", "v1"));                         // Goes to 1st log file
    ASSERT_OK(Put("big1", std::string(10000000, 'x')));  // Fills memtable
    ASSERT_OK(Put("big2", std::string(1000, 'y')));      // Triggers compaction
    ASSERT_OK(Put("bar", "v2"));                         // Goes to new log file

    Reopen(&options);
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_EQ("v2", Get("bar"));
    ASSERT_EQ(std::string(10000000, 'x'), Get("big1"));
    ASSERT_EQ(std::string(1000, 'y'), Get("big2"));
  } while (ChangeOptions());
}